

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElasticityCosseratAdvancedGenericFPM::UpdateEMatrix
          (ChElasticityCosseratAdvancedGenericFPM *this)

{
  Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
  local_20;
  
  if (this->updated == false) {
    ComputeTransformMatrix(this);
    local_20.m_lhs.m_lhs.m_matrix = &this->T;
    local_20.m_lhs.m_rhs = &this->Klaw;
    local_20.m_rhs = local_20.m_lhs.m_lhs.m_matrix;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,6,1,6,6>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,6,1,6,6>,0>>
              (local_20.m_lhs.m_rhs,&local_20);
    this->updated = true;
  }
  return;
}

Assistant:

void ChElasticityCosseratAdvancedGenericFPM::UpdateEMatrix() {
    if (!updated) {  // do it only once
        // compute T
        ComputeTransformMatrix();
        // update Klaw after setting section rotation and EC/SC offset
        this->Klaw = this->T.transpose() * this->Klaw * this->T;
        updated = true;
    }
}